

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psemaphore-posix.c
# Opt level: O0

pboolean pp_semaphore_create_handle(PSemaphore *sem,PError **error)

{
  pint pVar1;
  PErrorIPC code;
  sem_t *psVar2;
  bool bVar3;
  uint local_24;
  pint init_val;
  PError **error_local;
  PSemaphore *sem_local;
  
  bVar3 = true;
  if (sem != (PSemaphore *)0x0) {
    bVar3 = sem->platform_key == (pchar *)0x0;
  }
  if (bVar3) {
    p_error_set_error_p(error,0x25f,0,"Invalid input argument");
    sem_local._4_4_ = 0;
  }
  else {
    local_24 = sem->init_val;
    do {
      psVar2 = sem_open(sem->platform_key,0xc0,0x1b0,(ulong)local_24);
      sem->sem_hdl = (psem_hdl *)psVar2;
      bVar3 = false;
      if (psVar2 == (sem_t *)0x0) {
        pVar1 = p_error_get_last_system();
        bVar3 = pVar1 == 4;
      }
    } while (bVar3);
    if (sem->sem_hdl == (psem_hdl *)0x0) {
      pVar1 = p_error_get_last_system();
      if (pVar1 == 0x11) {
        if (sem->mode == P_SEM_ACCESS_CREATE) {
          sem_unlink(sem->platform_key);
        }
        else {
          local_24 = 0;
        }
        do {
          psVar2 = sem_open(sem->platform_key,0,0,(ulong)local_24);
          sem->sem_hdl = (psem_hdl *)psVar2;
          bVar3 = false;
          if (psVar2 == (sem_t *)0x0) {
            pVar1 = p_error_get_last_system();
            bVar3 = pVar1 == 4;
          }
        } while (bVar3);
      }
    }
    else {
      sem->sem_created = 1;
    }
    if (sem->sem_hdl == (psem_hdl *)0x0) {
      code = p_error_get_last_ipc();
      pVar1 = p_error_get_last_system();
      p_error_set_error_p(error,code,pVar1,"Failed to call sem_open() to create semaphore");
      pp_semaphore_clean_handle(sem);
      sem_local._4_4_ = 0;
    }
    else {
      sem_local._4_4_ = 1;
    }
  }
  return sem_local._4_4_;
}

Assistant:

static pboolean
pp_semaphore_create_handle (PSemaphore	*sem,
			    PError	**error)
{
	pint init_val;

	if (P_UNLIKELY (sem == NULL || sem->platform_key == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IPC_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	init_val = sem->init_val;

	/* Solaris may interrupt sem_open() call */
	while ((sem->sem_hdl = sem_open (sem->platform_key,
					 O_CREAT | O_EXCL,
					 0660,
					 init_val)) == P_SEM_INVALID_HDL &&
		p_error_get_last_system () == EINTR)
		;

	if (sem->sem_hdl == P_SEM_INVALID_HDL) {
		if (p_error_get_last_system () == EEXIST) {
			if (sem->mode == P_SEM_ACCESS_CREATE)
				sem_unlink (sem->platform_key);
			else
				init_val = 0;

			while ((sem->sem_hdl = sem_open (sem->platform_key,
							 0,
							 0,
							 init_val)) == P_SEM_INVALID_HDL &&
				p_error_get_last_system () == EINTR)
				;
		}
	} else
		sem->sem_created = TRUE;

	if (P_UNLIKELY (sem->sem_hdl == P_SEM_INVALID_HDL)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_last_ipc (),
				     p_error_get_last_system (),
				     "Failed to call sem_open() to create semaphore");
		pp_semaphore_clean_handle (sem);
		return FALSE;
	}

	return TRUE;
}